

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O3

void __thiscall ValidateDamageBin::CheckFormat(ValidateDamageBin *this)

{
  OASIS_FLOAT *pOVar1;
  OASIS_FLOAT *pOVar2;
  OASIS_FLOAT *pOVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  
  pcVar5 = fgets((char *)this,0x1000,_stdin);
  if (pcVar5 != (char *)0x0) {
    pOVar1 = &(this->dbd_).bin_from;
    pOVar2 = &(this->dbd_).bin_to;
    pOVar3 = &(this->dbd_).interpolation;
    piVar6 = &(this->dbd_).interval_type;
    iVar4 = __isoc99_sscanf(this,"%d,%f,%f,%f,%d",&this->dbd_,pOVar1,pOVar2,pOVar3,piVar6);
    if (iVar4 == 5) {
      CheckFormat(this);
      return;
    }
    iVar4 = __isoc99_sscanf(this,"%d,%f,%f,%f",&this->dbd_,pOVar1,pOVar2,pOVar3,piVar6);
    if (iVar4 == 4) {
      (this->dbd_).interval_type = 0;
      this->newFormat_ = true;
      return;
    }
    CheckFormat(this);
  }
  CheckFormat(this);
  return;
}

Assistant:

void ValidateDamageBin::CheckFormat() {

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanDeprecatedFormat() == 5) {

      fprintf(stderr, "WARNING: Deprecated format:"
                      " interval_type column no longer required.\n");
      newFormat_ = false;
      warnings_ = true;
      return;

    } else if (ScanNewFormat() == 4) {

      // Although interval type has been dropped in the new format, it exists
      // in the binary file for backwards compatibility. Therefore, the
      // "missing" interval type from the csv file is set to 0.
      dbd_.interval_type = 0;
      newFormat_ = true;
      return;

    }

    // Could not find valid format
    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // No line read
  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}